

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O0

void output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,ostream *stream)

{
  iterator this;
  bool bVar1;
  reference puVar2;
  ostream *poVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  iterator it;
  ostream *stream_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  it._M_current = (uint *)stream;
  local_20._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(vec)
  ;
  while( true ) {
    local_28._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(vec)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    this = it;
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_20);
    poVar3 = (ostream *)std::ostream::operator<<(this._M_current,*puVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_20);
  }
  std::operator<<((ostream *)it._M_current,"\n");
  return;
}

Assistant:

void output_vec(T vec, std::ostream & stream=std::clog) 
{
  for (auto it = vec.begin(); it != vec.end(); ++it)
  {
    stream << *it << " ";
  }
  stream << "\n";
  return;
}